

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O2

void __thiscall gvr::PointCloud::savePLY(PointCloud *this,char *name,bool all,ply_encoding enc)

{
  ply_encoding pVar1;
  undefined4 in_register_0000000c;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_03;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_04;
  void *__buf_06;
  string *name_00;
  int i;
  long lVar2;
  allocator local_299;
  string local_298;
  PLYWriter ply;
  
  pVar1 = enc;
  PLYWriter::PLYWriter(&ply);
  PLYWriter::open(&ply,name,enc);
  Model::setOriginToPLY(&this->super_Model,&ply);
  std::__cxx11::string::string((string *)&local_298,"vertex",&local_299);
  PLYWriter::addElement(&ply,&local_298,(long)this->n);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string((string *)&local_298,"x",&local_299);
  PLYWriter::addProperty(&ply,&local_298,ply_float32);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string((string *)&local_298,"y",&local_299);
  PLYWriter::addProperty(&ply,&local_298,ply_float32);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string((string *)&local_298,"z",&local_299);
  name_00 = &local_298;
  PLYWriter::addProperty(&ply,name_00,ply_float32);
  std::__cxx11::string::~string((string *)&local_298);
  if (this->scanprop == (float *)0x0) {
    __buf_06 = extraout_RDX;
    if (!all) goto LAB_0012a012;
  }
  else {
    std::__cxx11::string::string((string *)&local_298,"scan_size",&local_299);
    name_00 = &local_298;
    PLYWriter::addProperty(&ply,name_00,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
    __buf_06 = extraout_RDX_00;
    if (!all) goto LAB_0012a012;
    std::__cxx11::string::string((string *)&local_298,"scan_error",&local_299);
    PLYWriter::addProperty(&ply,&local_298,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string((string *)&local_298,"scan_conf",&local_299);
    name_00 = &local_298;
    PLYWriter::addProperty(&ply,name_00,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
    __buf_06 = extraout_RDX_01;
  }
  if (this->scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&local_298,"sx",&local_299);
    PLYWriter::addProperty(&ply,&local_298,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string((string *)&local_298,"sy",&local_299);
    PLYWriter::addProperty(&ply,&local_298,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string((string *)&local_298,"sz",&local_299);
    name_00 = &local_298;
    PLYWriter::addProperty(&ply,name_00,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
    __buf_06 = extraout_RDX_02;
  }
LAB_0012a012:
  lVar2 = 0;
  do {
    if (this->n <= lVar2) {
      PLYWriter::close(&ply,(int)name_00);
      PLYWriter::~PLYWriter(&ply);
      return;
    }
    PLYWriter::write(&ply,(int)name_00,__buf_06,CONCAT44(in_register_0000000c,pVar1));
    PLYWriter::write(&ply,(int)name_00,__buf,CONCAT44(in_register_0000000c,pVar1));
    PLYWriter::write(&ply,(int)name_00,__buf_00,CONCAT44(in_register_0000000c,pVar1));
    if (this->scanprop == (float *)0x0) {
      __buf_06 = __buf_01;
      if (all) goto LAB_0012a0be;
    }
    else {
      PLYWriter::write(&ply,(int)name_00,__buf_01,CONCAT44(in_register_0000000c,pVar1));
      __buf_06 = __buf_02;
      if (all) {
        PLYWriter::write(&ply,(int)name_00,__buf_02,CONCAT44(in_register_0000000c,pVar1));
        PLYWriter::write(&ply,(int)name_00,__buf_03,CONCAT44(in_register_0000000c,pVar1));
        __buf_06 = extraout_RDX_03;
LAB_0012a0be:
        if (this->scanpos != (float *)0x0) {
          PLYWriter::write(&ply,(int)name_00,__buf_06,CONCAT44(in_register_0000000c,pVar1));
          PLYWriter::write(&ply,(int)name_00,__buf_04,CONCAT44(in_register_0000000c,pVar1));
          PLYWriter::write(&ply,(int)name_00,__buf_05,CONCAT44(in_register_0000000c,pVar1));
          __buf_06 = extraout_RDX_04;
        }
      }
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void PointCloud::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  // define header

  ply.open(name, enc);

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }
  }

  ply.close();
}